

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::labelidx<wasm::WATParser::NullCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,NullCtx *ctx,bool inDelegate)

{
  bool bVar1;
  Ok *u;
  allocator<char> local_f1;
  string local_f0;
  Err local_d0;
  uint local_ac;
  Err local_a8;
  Err *local_88;
  Err *err;
  MaybeResult<wasm::Ok> _val;
  undefined1 local_48 [8];
  MaybeResult<wasm::Ok> idx;
  bool inDelegate_local;
  NullCtx *ctx_local;
  
  idx.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._39_1_ = inDelegate;
  maybeLabelidx<wasm::WATParser::NullCtx>((MaybeResult<wasm::Ok> *)local_48,ctx,inDelegate);
  bVar1 = wasm::MaybeResult::operator_cast_to_bool((MaybeResult *)local_48);
  if (bVar1) {
    MaybeResult<wasm::Ok>::MaybeResult
              ((MaybeResult<wasm::Ok> *)&err,(MaybeResult<wasm::Ok> *)local_48);
    local_88 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err);
    bVar1 = local_88 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_a8,local_88);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_a8);
      wasm::Err::~Err(&local_a8);
    }
    local_ac = (uint)bVar1;
    MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err);
    if (local_ac == 0) {
      u = MaybeResult<wasm::Ok>::operator*((MaybeResult<wasm::Ok> *)local_48);
      Result<wasm::Ok>::Result<wasm::Ok&>(__return_storage_ptr__,u);
      local_ac = 1;
    }
  }
  else {
    local_ac = 0;
  }
  MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)local_48);
  if (local_ac == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"expected label index or identifier",&local_f1);
    Lexer::err(&local_d0,&ctx->in,&local_f0);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_d0);
    wasm::Err::~Err(&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::LabelIdxT> labelidx(Ctx& ctx, bool inDelegate) {
  if (auto idx = maybeLabelidx(ctx, inDelegate)) {
    CHECK_ERR(idx);
    return *idx;
  }
  return ctx.in.err("expected label index or identifier");
}